

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O3

void __thiscall SubprocessTestBadCommandStderr::Run(SubprocessTestBadCommandStderr *this)

{
  Test *pTVar1;
  bool bVar2;
  ExitStatus EVar3;
  int iVar4;
  Subprocess *this_00;
  string *psVar5;
  SubprocessSet *this_01;
  string local_40;
  
  this_01 = &(this->super_SubprocessTest).subprocs_;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"cmd /c ninja_no_such_command","");
  this_00 = SubprocessSet::Add(this_01,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  bVar2 = testing::Test::Check
                    (g_current_test,this_00 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0x2e,"(Subprocess *) 0 != subproc");
  if (bVar2) {
    while( true ) {
      bVar2 = Subprocess::Done(this_00);
      pTVar1 = g_current_test;
      if (bVar2) break;
      SubprocessSet::DoWork(this_01);
    }
    EVar3 = Subprocess::Finish(this_00);
    testing::Test::Check
              (pTVar1,EVar3 == ExitFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
               ,0x35,"ExitFailure == subproc->Finish()");
    pTVar1 = g_current_test;
    psVar5 = Subprocess::GetOutput_abi_cxx11_(this_00);
    iVar4 = std::__cxx11::string::compare((char *)psVar5);
    testing::Test::Check
              (pTVar1,iVar4 != 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
               ,0x36,"\"\" != subproc->GetOutput()");
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, BadCommandStderr) {
  Subprocess* subproc = subprocs_.Add("cmd /c ninja_no_such_command");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    // Pretend we discovered that stderr was ready for writing.
    subprocs_.DoWork();
  }

  EXPECT_EQ(ExitFailure, subproc->Finish());
  EXPECT_NE("", subproc->GetOutput());
}